

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O2

int mbedtls_x509_dn_gets(char *buf,size_t size,mbedtls_x509_name *dn)

{
  byte bVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  char *__format;
  size_t __maxlen;
  ulong __maxlen_00;
  byte bVar7;
  bool bVar8;
  char *short_name;
  mbedtls_x509_name *local_140;
  char s [256];
  
  short_name = (char *)0x0;
  memset(s,0,0x100);
  uVar2 = '\0';
  __maxlen = size;
  local_140 = dn;
  do {
    if (dn == (mbedtls_x509_name *)0x0) {
      return (int)size - (int)__maxlen;
    }
    if ((dn->oid).p != (uchar *)0x0) {
      if (dn != local_140) {
        __format = " + ";
        if (uVar2 == '\0') {
          __format = ", ";
        }
        uVar3 = snprintf(buf,__maxlen,__format);
        if ((int)uVar3 < 0) {
          return -0x2980;
        }
        uVar5 = (ulong)uVar3;
        bVar8 = __maxlen < uVar5;
        __maxlen = __maxlen - uVar5;
        if (bVar8 || __maxlen == 0) {
          return -0x2980;
        }
        buf = buf + uVar5;
      }
      iVar4 = mbedtls_oid_get_attr_short_name(&dn->oid,&short_name);
      if (iVar4 == 0) {
        uVar3 = snprintf(buf,__maxlen,"%s=");
      }
      else {
        uVar3 = snprintf(buf,__maxlen,"??=");
      }
      if ((int)uVar3 < 0) {
        return -0x2980;
      }
      uVar5 = (ulong)uVar3;
      __maxlen_00 = __maxlen - uVar5;
      if (__maxlen < uVar5 || __maxlen_00 == 0) {
        return -0x2980;
      }
      for (uVar6 = 0; (uVar6 < 0xff && (uVar6 < (dn->val).len)); uVar6 = uVar6 + 1) {
        bVar1 = (dn->val).p[uVar6];
        bVar7 = 0x3f;
        if (0x1e < (byte)(bVar1 + 0x7f)) {
          bVar7 = bVar1;
        }
        if (bVar1 == 0x7f) {
          bVar7 = 0x3f;
        }
        if (bVar1 < 0x20) {
          bVar7 = 0x3f;
        }
        s[uVar6] = bVar7;
      }
      s[uVar6] = '\0';
      uVar3 = snprintf(buf + uVar5,__maxlen_00,"%s");
      if ((int)uVar3 < 0) {
        return -0x2980;
      }
      uVar6 = (ulong)uVar3;
      __maxlen = __maxlen_00 - uVar6;
      if (__maxlen_00 < uVar6 || __maxlen == 0) {
        return -0x2980;
      }
      buf = buf + uVar5 + uVar6;
      uVar2 = dn->next_merged;
    }
    dn = dn->next;
  } while( true );
}

Assistant:

int mbedtls_x509_dn_gets( char *buf, size_t size, const mbedtls_x509_name *dn )
{
    int ret;
    size_t i, n;
    unsigned char c, merge = 0;
    const mbedtls_x509_name *name;
    const char *short_name = NULL;
    char s[MBEDTLS_X509_MAX_DN_NAME_SIZE], *p;

    memset( s, 0, sizeof( s ) );

    name = dn;
    p = buf;
    n = size;

    while( name != NULL )
    {
        if( !name->oid.p )
        {
            name = name->next;
            continue;
        }

        if( name != dn )
        {
            ret = mbedtls_snprintf( p, n, merge ? " + " : ", " );
            MBEDTLS_X509_SAFE_SNPRINTF;
        }

        ret = mbedtls_oid_get_attr_short_name( &name->oid, &short_name );

        if( ret == 0 )
            ret = mbedtls_snprintf( p, n, "%s=", short_name );
        else
            ret = mbedtls_snprintf( p, n, "\?\?=" );
        MBEDTLS_X509_SAFE_SNPRINTF;

        for( i = 0; i < name->val.len; i++ )
        {
            if( i >= sizeof( s ) - 1 )
                break;

            c = name->val.p[i];
            if( c < 32 || c == 127 || ( c > 128 && c < 160 ) )
                 s[i] = '?';
            else s[i] = c;
        }
        s[i] = '\0';
        ret = mbedtls_snprintf( p, n, "%s", s );
        MBEDTLS_X509_SAFE_SNPRINTF;

        merge = name->next_merged;
        name = name->next;
    }

    return( (int) ( size - n ) );
}